

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O0

void __thiscall BtorSimVCDWriter::update_time(BtorSimVCDWriter *this,int64_t k)

{
  bool bVar1;
  reference ppVar2;
  long in_RSI;
  long in_RDI;
  pair<const_long,_BtorSimVCDWriter::ClkType> clk_1;
  iterator __end2;
  iterator __begin2;
  map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
  *__range2;
  pair<const_long,_BtorSimVCDWriter::ClkType> clk;
  iterator __end3;
  iterator __begin3;
  map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
  *__range3;
  value_type *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  long in_stack_fffffffffffffd88;
  string local_238 [24];
  int64_t in_stack_fffffffffffffde0;
  BtorSimVCDWriter *in_stack_fffffffffffffde8;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  long local_178;
  undefined8 uStack_170;
  _Self local_160;
  _Self local_158;
  long local_150;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  long local_88;
  undefined8 uStack_80;
  _Self local_78;
  _Self local_70;
  long local_68;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  if (*(long *)(in_RDI + 0x210) < in_RSI) {
    local_10 = in_RSI;
    if (0 < in_RSI) {
      std::__cxx11::to_string(in_stack_fffffffffffffd88);
      std::operator+((char *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      std::__cxx11::string::~string(local_30);
      std::__cxx11::string::~string(local_50);
      local_68 = in_RDI + 0x2b0;
      local_70._M_node =
           (_Base_ptr)
           std::
           map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
           ::begin((map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
                    *)in_stack_fffffffffffffd38);
      local_78._M_node =
           (_Base_ptr)
           std::
           map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
           ::end((map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
                  *)in_stack_fffffffffffffd38);
      while (bVar1 = std::operator!=(&local_70,&local_78), bVar1) {
        ppVar2 = std::_Rb_tree_iterator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>::
                 operator*((_Rb_tree_iterator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_> *)
                           0x125c0b);
        local_88 = ppVar2->first;
        uStack_80 = *(undefined8 *)&ppVar2->second;
        if ((int)uStack_80 == 0) {
          get_bv_identifier_abi_cxx11_(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
          std::operator+((char *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
          std::__cxx11::string::~string(local_a8);
          std::__cxx11::string::~string(local_c8);
        }
        else if ((int)uStack_80 == 1) {
          in_stack_fffffffffffffd88 = in_RDI + 0x278;
          get_bv_identifier_abi_cxx11_(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
          std::operator+((char *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
          std::__cxx11::string::~string(local_e8);
          std::__cxx11::string::~string(local_108);
        }
        std::_Rb_tree_iterator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_> *)
                   in_stack_fffffffffffffd40);
      }
    }
    std::__cxx11::to_string(in_stack_fffffffffffffd88);
    std::operator+((char *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_148);
    *(long *)(in_RDI + 0x210) = local_10;
    local_150 = in_RDI + 0x2b0;
    local_158._M_node =
         (_Base_ptr)
         std::
         map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
         ::begin((map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
                  *)in_stack_fffffffffffffd38);
    local_160._M_node =
         (_Base_ptr)
         std::
         map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
         ::end((map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
                *)in_stack_fffffffffffffd38);
    while (bVar1 = std::operator!=(&local_158,&local_160), bVar1) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_> *)
                          0x125f2b);
      local_178 = ppVar2->first;
      uStack_170 = *(undefined8 *)&ppVar2->second;
      if ((int)uStack_170 == 0) {
        get_bv_identifier_abi_cxx11_(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        std::operator+((char *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        std::__cxx11::string::~string(local_198);
        std::__cxx11::string::~string(local_1b8);
      }
      else if ((int)uStack_170 == 1) {
        get_bv_identifier_abi_cxx11_(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        std::operator+((char *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        std::__cxx11::string::~string(local_1d8);
        std::__cxx11::string::~string(local_1f8);
      }
      else if ((int)uStack_170 == 2) {
        in_stack_fffffffffffffd40 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x278);
        in_stack_fffffffffffffd48 = local_238;
        get_bv_identifier_abi_cxx11_(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        std::operator+((char *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffde8);
        std::__cxx11::string::~string(local_238);
      }
      std::_Rb_tree_iterator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_> *)
                 in_stack_fffffffffffffd40);
    }
  }
  return;
}

Assistant:

void
BtorSimVCDWriter::update_time (int64_t k)
{
  if (current_step < k)
  {
    if (k > 0)
    {
      value_changes.push_back ("#" + std::to_string (k * 10 - 5));
      for (auto clk : clocks)
      {
        switch (clk.second)
        {
          case POSEDGE:
            value_changes.push_back ("0" + get_bv_identifier (clk.first));
            break;
          case NEGEDGE:
            value_changes.push_back ("1" + get_bv_identifier (clk.first));
            break;
          case EVENT: break;
        }
      }
    }
    value_changes.push_back ("#" + std::to_string (k * 10));
    current_step = k;
    for (auto clk : clocks)
    {
      switch (clk.second)
      {
        case POSEDGE:
          value_changes.push_back ("1" + get_bv_identifier (clk.first));
          break;
        case NEGEDGE:
          value_changes.push_back ("0" + get_bv_identifier (clk.first));
          break;
        case EVENT:
          value_changes.push_back ("1" + get_bv_identifier (clk.first));
          break;
      }
    }
  }
}